

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationDriveline::Update
          (ChLinkMotorRotationDriveline *this,double mytime,bool update_assets)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChBodyFrame *pCVar13;
  ChBodyFrame *pCVar14;
  element_type *peVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ChVector<double> abs_shaftdir;
  ulong local_68;
  double local_60;
  ulong local_58;
  ChCoordsys<double> local_50;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  (**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem + 0x1f8
              ))(&local_50,this);
  ChCoordsys<double>::TransformDirectionLocalToParent(&local_50,(ChVector<double> *)&VECT_Z);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_68;
  pCVar13 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body1;
  pCVar14 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar1 = vfmadd231sd_fma(auVar23,auVar19,auVar1);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_58;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar1 = vfmadd231sd_fma(auVar1,auVar22,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar2 = vfmadd231sd_fma(auVar30,auVar19,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar2 = vfmadd231sd_fma(auVar2,auVar22,auVar4);
  dVar18 = auVar2._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar2 = vfmadd231sd_fma(auVar31,auVar19,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar13->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar2 = vfmadd231sd_fma(auVar2,auVar22,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar3 = vfmadd231sd_fma(auVar24,auVar19,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar3 = vfmadd231sd_fma(auVar3,auVar22,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar4 = vfmadd231sd_fma(auVar27,auVar19,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar4 = vfmadd231sd_fma(auVar4,auVar22,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_60 *
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar5 = vfmadd231sd_fma(auVar28,auVar19,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar5 = vfmadd231sd_fma(auVar5,auVar22,auVar12);
  peVar15 = (this->innerconstraint1).
            super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar18 * dVar18;
  auVar6 = vfmadd231sd_fma(auVar20,auVar1,auVar1);
  auVar6 = vfmadd231sd_fma(auVar6,auVar2,auVar2);
  auVar25._0_8_ = auVar3._0_8_;
  dVar26 = auVar4._0_8_;
  auVar29._0_8_ = auVar5._0_8_;
  if (auVar6._0_8_ < 0.0) {
    dVar17 = sqrt(auVar6._0_8_);
    auVar29._8_8_ = 0;
    auVar25._8_8_ = 0;
    auVar3 = auVar25;
    auVar5 = auVar29;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar6,auVar6);
    dVar17 = auVar4._0_8_;
  }
  bVar16 = 2.2250738585072014e-308 <= dVar17;
  dVar17 = 1.0 / dVar17;
  (peVar15->shaft_dir).m_data[0] =
       (double)((ulong)bVar16 * (long)(auVar1._0_8_ * dVar17) + (ulong)!bVar16 * 0x3ff0000000000000)
  ;
  (peVar15->shaft_dir).m_data[1] = (double)((ulong)bVar16 * (long)(dVar18 * dVar17));
  (peVar15->shaft_dir).m_data[2] = (double)((ulong)bVar16 * (long)(auVar2._0_8_ * dVar17));
  peVar15 = (this->innerconstraint2).
            super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar26 * dVar26;
  auVar1 = vfmadd231sd_fma(auVar21,auVar3,auVar3);
  auVar1 = vfmadd231sd_fma(auVar1,auVar5,auVar5);
  if (auVar1._0_8_ < 0.0) {
    dVar18 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar18 = auVar1._0_8_;
    auVar25._0_8_ = auVar3._0_8_;
    auVar29._0_8_ = auVar5._0_8_;
  }
  bVar16 = 2.2250738585072014e-308 <= dVar18;
  dVar18 = 1.0 / dVar18;
  (peVar15->shaft_dir).m_data[0] =
       (double)((ulong)bVar16 * (long)(auVar25._0_8_ * dVar18) + (ulong)!bVar16 * 0x3ff0000000000000
               );
  (peVar15->shaft_dir).m_data[1] = (double)((ulong)bVar16 * (long)(dVar26 * dVar18));
  (peVar15->shaft_dir).m_data[2] = (double)((ulong)bVar16 * (long)(auVar29._0_8_ * dVar18));
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Update the direction of 1D-3D ChShaftBody constraints:
    ChVector<> abs_shaftdir = this->GetLinkAbsoluteCoords().TransformDirectionLocalToParent(VECT_Z);
    ChVector<> shaftdir_b1 = this->Body1->TransformDirectionParentToLocal(abs_shaftdir);
    ChVector<> shaftdir_b2 = this->Body2->TransformDirectionParentToLocal(abs_shaftdir);

    innerconstraint1->SetShaftDirection(shaftdir_b1);
    innerconstraint2->SetShaftDirection(shaftdir_b2);
}